

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_sse4.c
# Opt level: O2

void find_eob(tran_low_t *qcoeff_ptr,int16_t *iscan,__m128i *eob)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  short sVar18;
  undefined1 auVar19 [16];
  
  auVar10._0_4_ = -(uint)(*qcoeff_ptr == 0);
  auVar10._4_4_ = -(uint)(qcoeff_ptr[1] == 0);
  auVar10._8_4_ = -(uint)(qcoeff_ptr[2] == 0);
  auVar10._12_4_ = -(uint)(qcoeff_ptr[3] == 0);
  auVar19._0_4_ = -(uint)(qcoeff_ptr[4] == 0);
  auVar19._4_4_ = -(uint)(qcoeff_ptr[5] == 0);
  auVar19._8_4_ = -(uint)(qcoeff_ptr[6] == 0);
  auVar19._12_4_ = -(uint)(qcoeff_ptr[7] == 0);
  auVar10 = packssdw(auVar10,auVar19);
  auVar11._0_2_ = *iscan + auVar10._0_2_ + 1;
  auVar11._2_2_ = iscan[1] + auVar10._2_2_ + 1;
  auVar11._4_2_ = iscan[2] + auVar10._4_2_ + 1;
  auVar11._6_2_ = iscan[3] + auVar10._6_2_ + 1;
  auVar11._8_2_ = iscan[4] + auVar10._8_2_ + 1;
  auVar11._10_2_ = iscan[5] + auVar10._10_2_ + 1;
  auVar11._12_2_ = iscan[6] + auVar10._12_2_ + 1;
  auVar11._14_2_ = iscan[7] + auVar10._14_2_ + 1;
  auVar11 = ~auVar10 & auVar11;
  sVar1 = (short)(*eob)[0];
  sVar2 = *(short *)((long)*eob + 2);
  sVar3 = *(short *)((long)*eob + 4);
  sVar4 = *(short *)((long)*eob + 6);
  sVar5 = (short)(*eob)[1];
  sVar6 = *(short *)((long)*eob + 10);
  sVar7 = *(short *)((long)*eob + 0xc);
  sVar8 = *(short *)((long)*eob + 0xe);
  sVar9 = auVar11._0_2_;
  sVar12 = auVar11._2_2_;
  sVar13 = auVar11._4_2_;
  sVar14 = auVar11._6_2_;
  sVar15 = auVar11._8_2_;
  sVar16 = auVar11._10_2_;
  sVar17 = auVar11._12_2_;
  sVar18 = auVar11._14_2_;
  *(ushort *)*eob = (ushort)(sVar9 < sVar1) * sVar1 | (ushort)(sVar9 >= sVar1) * sVar9;
  *(ushort *)((long)*eob + 2) =
       (ushort)(sVar12 < sVar2) * sVar2 | (ushort)(sVar12 >= sVar2) * sVar12;
  *(ushort *)((long)*eob + 4) =
       (ushort)(sVar13 < sVar3) * sVar3 | (ushort)(sVar13 >= sVar3) * sVar13;
  *(ushort *)((long)*eob + 6) =
       (ushort)(sVar14 < sVar4) * sVar4 | (ushort)(sVar14 >= sVar4) * sVar14;
  *(ushort *)(*eob + 1) = (ushort)(sVar15 < sVar5) * sVar5 | (ushort)(sVar15 >= sVar5) * sVar15;
  *(ushort *)((long)*eob + 10) =
       (ushort)(sVar16 < sVar6) * sVar6 | (ushort)(sVar16 >= sVar6) * sVar16;
  *(ushort *)((long)*eob + 0xc) =
       (ushort)(sVar17 < sVar7) * sVar7 | (ushort)(sVar17 >= sVar7) * sVar17;
  *(ushort *)((long)*eob + 0xe) =
       (ushort)(sVar18 < sVar8) * sVar8 | (ushort)(sVar18 >= sVar8) * sVar18;
  return;
}

Assistant:

static inline void find_eob(tran_low_t *qcoeff_ptr, const int16_t *iscan,
                            __m128i *eob) {
  const __m128i zero = _mm_setzero_si128();
  __m128i mask, iscanIdx;
  const __m128i q0 = _mm_loadu_si128((__m128i const *)qcoeff_ptr);
  const __m128i q1 = _mm_loadu_si128((__m128i const *)(qcoeff_ptr + 4));
  __m128i nz_flag0 = _mm_cmpeq_epi32(q0, zero);
  __m128i nz_flag1 = _mm_cmpeq_epi32(q1, zero);

  nz_flag0 = _mm_cmpeq_epi32(nz_flag0, zero);
  nz_flag1 = _mm_cmpeq_epi32(nz_flag1, zero);

  mask = _mm_packs_epi32(nz_flag0, nz_flag1);
  iscanIdx = _mm_loadu_si128((__m128i const *)iscan);
  iscanIdx = _mm_sub_epi16(iscanIdx, mask);
  iscanIdx = _mm_and_si128(iscanIdx, mask);
  *eob = _mm_max_epi16(*eob, iscanIdx);
}